

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O3

void __thiscall Arena_PtrNoConNoDecon_Test::TestBody(Arena_PtrNoConNoDecon_Test *this)

{
  _frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *p_Var1;
  char *message;
  pointer *__ptr_1;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *in_R9;
  pointer *__ptr;
  bool bVar2;
  Arena arena;
  AssertHelper AStack_a8;
  Message local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  undefined1 local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  Arena local_50;
  
  memt::Arena::Arena(&local_50);
  local_90[0] = (internal)
                (local_50._blocks._block._begin == local_50._blocks._block._position &&
                local_50._blocks._block._previous == (Block *)0x0);
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50._blocks._block._begin == local_50._blocks._block._position &&
      local_50._blocks._block._previous == (Block *)0x0) {
    if ((ulong)((long)local_50._blocks._block._end - (long)local_50._blocks._block._position) < 8) {
      memt::Arena::growCapacity(&local_50,8);
      bVar2 = local_50._blocks._block._previous != (Block *)0x0;
      p_Var1 = (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
               local_50._blocks._block._begin;
    }
    else {
      bVar2 = false;
      p_Var1 = (_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
               local_50._blocks._block._position;
    }
    local_50._blocks._block._position =
         (char *)((_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
                  local_50._blocks._block._position + 8);
    local_90[0] = (internal)
                  ((_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
                   local_50._blocks._block._position != p_Var1 | bVar2);
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(internal *)local_90,(AssertionResult *)"arena.isEmpty()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xd3,local_70._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if ((long *)CONCAT71(local_a0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_a0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_a0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_a0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
    }
    else {
      if ((ulong)((long)local_50._blocks._block._end - (long)local_50._blocks._block._position) < 8)
      {
        memt::Arena::growCapacity(&local_50,8);
      }
      local_50._blocks._block._position =
           (char *)((_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
                    local_50._blocks._block._position + 8);
      if ((ulong)((long)local_50._blocks._block._end - (long)local_50._blocks._block._position) < 8)
      {
        memt::Arena::growCapacity(&local_50,8);
      }
      local_50._blocks._block._position =
           (char *)((_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
                    local_50._blocks._block._position + 8);
      if ((ulong)((long)local_50._blocks._block._end - (long)local_50._blocks._block._position) < 8)
      {
        memt::Arena::growCapacity(&local_50,8);
      }
      local_50._blocks._block._position =
           (char *)((_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL> *)
                    local_50._blocks._block._position + 8);
      local_90[0] = (internal)
                    (local_50._blocks._block._position != local_50._blocks._block._begin ||
                    local_50._blocks._block._previous != (Block *)0x0);
      local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_50._blocks._block._position != local_50._blocks._block._begin ||
          local_50._blocks._block._previous != (Block *)0x0) {
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                            *)&local_50);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                            *)&local_50);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                            *)&local_50);
        memt::Arena::
        PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
        ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                            *)&local_50);
        local_90[0] = (internal)
                      (local_50._blocks._block._begin == local_50._blocks._block._position &&
                      local_50._blocks._block._previous == (Block *)0x0);
        local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_50._blocks._block._begin != local_50._blocks._block._position ||
            local_50._blocks._block._previous != (Block *)0x0) {
          testing::Message::Message(&local_a0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_70,(internal *)local_90,(AssertionResult *)"arena.isEmpty()","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&AStack_a8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                     ,0xd9,local_70._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&AStack_a8,&local_a0);
          goto LAB_0010fb1f;
        }
        std::__cxx11::stringbuf::str();
        std::ios::clear((int)*(undefined8 *)
                              ((anonymous_namespace)::
                               _frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,0ul>
                               ::_log_abi_cxx11_ + -0x18) + 0x15dc00);
        local_70._M_string_length = 0;
        local_70.field_2._M_local_buf[0] = '\0';
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::stringbuf::str((string *)&DAT_0015dc08);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,
                          CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                   local_70.field_2._M_local_buf[0]) + 1);
        }
        message = "";
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[1]>
                  ((internal *)&local_a0,"PtrNoConNoDeconHelper::resetLog()","\"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   (char (*) [1])0x145867);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_90._1_7_,local_90[0]) != &local_80) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_90._1_7_,local_90[0]),local_80._M_allocated_capacity + 1
                         );
        }
        if (local_a0.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ == (internal)0x0) {
          testing::Message::Message((Message *)&local_70);
          if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = (local_98->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_90,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                     ,0xda,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)&local_70);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
          }
        }
        if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        goto LAB_0010ff4f;
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98;
        goto LAB_0010fb63;
      }
      testing::Message::Message(&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(internal *)local_90,(AssertionResult *)"arena.isEmpty()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0xd7,local_70._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if ((long *)CONCAT71(local_a0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_a0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_a0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_a0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
      if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_88,local_88);
      }
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                          *)&local_50);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                          *)&local_50);
      memt::Arena::
      PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
      ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                          *)&local_50);
    }
    memt::Arena::
    PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
    ::~PtrNoConNoDecon((PtrNoConNoDecon<(anonymous_namespace)::_frobby_Helper<(anonymous_namespace)::_frobby_PtrNoConNoDeconHelperTag,_0UL>_>
                        *)&local_50);
  }
  else {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_90,(AssertionResult *)"arena.isEmpty()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0xd0,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_a8,&local_a0);
LAB_0010fb1f:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_88;
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((long *)CONCAT71(local_a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_a0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_a0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
    local_98 = local_88;
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_0010ff4f;
LAB_0010fb63:
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,local_98);
  }
LAB_0010ff4f:
  memt::Arena::~Arena(&local_50);
  return;
}

Assistant:

TEST(Arena, PtrNoConNoDecon) {
  memt::Arena arena;
  ASSERT_TRUE(arena.isEmpty());
  {
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr1(arena);
	ASSERT_FALSE(arena.isEmpty());
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr2(arena);
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr3(arena);
	memt::Arena::PtrNoConNoDecon<PtrNoConNoDeconHelper> ptr4(arena);
	ASSERT_FALSE(arena.isEmpty());
  }
  ASSERT_TRUE(arena.isEmpty());
  ASSERT_EQ(PtrNoConNoDeconHelper::resetLog(), "");
}